

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name_posix.cpp
# Opt level: O0

string * pstore::process_file_name_abi_cxx11_(void)

{
  ulong uVar1;
  char *pcVar2;
  string *in_RDI;
  allocator local_17d [13];
  char *local_170;
  ulong local_168;
  size_t length;
  small_vector<char,_256UL> buffer;
  anon_class_8_1_89901123 read_link;
  string path;
  
  (anonymous_namespace)::link_path_abi_cxx11_();
  buffer.buffer_ = (char *)&read_link;
  small_vector<char,_256UL>::small_vector((small_vector<char,_256UL> *)&length);
  local_170 = buffer.buffer_;
  local_168 = process_file_name<pstore::process_file_name[abi:cxx11]()::__0,pstore::small_vector<char,256ul>>
                        ((anon_class_8_1_89901123)buffer.buffer_,
                         (small_vector<char,_256UL> *)&length);
  pcVar2 = small_vector<char,_256UL>::data((small_vector<char,_256UL> *)&length);
  uVar1 = local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar2,uVar1,local_17d);
  std::allocator<char>::~allocator((allocator<char> *)local_17d);
  small_vector<char,_256UL>::~small_vector((small_vector<char,_256UL> *)&length);
  std::__cxx11::string::~string((string *)&read_link);
  return in_RDI;
}

Assistant:

std::string process_file_name () {
        std::string const path = link_path ();
        auto read_link = [&path] (gsl::span<char> const buffer) {
            auto const buffer_size = buffer.size ();
            PSTORE_ASSERT (buffer_size >= 0);
            ssize_t const num_chars = ::readlink (path.c_str (), buffer.data (),
                                                  clamp (static_cast<std::size_t> (buffer_size),
                                                         std::size_t{0}, std::size_t{SSIZE_MAX}));
            if (num_chars < 0) {
                int const error = errno;
                std::ostringstream str;
                str << "readlink() of \"" << path << "\" failed";
                raise (errno_erc{error}, str.str ());
            }
            PSTORE_STATIC_ASSERT (std::numeric_limits<std::size_t>::max () >=
                                  unsigned_cast (std::numeric_limits<ssize_t>::max ()));
            return static_cast<std::size_t> (num_chars);
        };

        small_vector<char> buffer;
        std::size_t const length = process_file_name (read_link, buffer);
        return {buffer.data (), length};
    }